

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

Tag * __thiscall
Mustache::Renderer::findEndTag
          (Tag *__return_storage_ptr__,Renderer *this,QString *content,Tag *startTag,int endPos)

{
  bool bVar1;
  QString local_88;
  int local_6c;
  undefined1 local_68 [8];
  Tag nextTag;
  int local_30;
  int pos;
  int tagDepth;
  int endPos_local;
  Tag *startTag_local;
  QString *content_local;
  Renderer *this_local;
  
  local_30 = 1;
  nextTag.indentation = startTag->end;
  do {
    findTag((Tag *)local_68,this,content,nextTag.indentation,endPos);
    if (local_68._0_4_ == Null) {
      Tag::Tag(__return_storage_ptr__,(Tag *)local_68);
      local_6c = 1;
    }
    else {
      if ((local_68._0_4_ == SectionStart) || (local_68._0_4_ == InvertedSectionStart)) {
        local_30 = local_30 + 1;
      }
      else if ((local_68._0_4_ == SectionEnd) && (local_30 = local_30 + -1, local_30 == 0)) {
        bVar1 = operator!=((QString *)&nextTag,&startTag->key);
        if (bVar1) {
          QString::QString(&local_88,"Tag start/end key mismatch");
          setError(this,&local_88,(int)nextTag.key.d.size);
          QString::~QString(&local_88);
          Tag::Tag(__return_storage_ptr__);
          local_6c = 1;
        }
        else {
          Tag::Tag(__return_storage_ptr__,(Tag *)local_68);
          local_6c = 1;
        }
        goto LAB_0012044f;
      }
      nextTag.indentation = nextTag.key.d.size._4_4_;
      local_6c = 0;
    }
LAB_0012044f:
    Tag::~Tag((Tag *)local_68);
    if (local_6c != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Tag Renderer::findEndTag(const QString& content, const Tag& startTag, int endPos)
{
	int tagDepth = 1;
	int pos = startTag.end;

	while (true) {
		Tag nextTag = findTag(content, pos, endPos);
		if (nextTag.type == Tag::Null) {
			return nextTag;
		} else if (nextTag.type == Tag::SectionStart || nextTag.type == Tag::InvertedSectionStart) {
			++tagDepth;
		} else if (nextTag.type == Tag::SectionEnd) {
			--tagDepth;
			if (tagDepth == 0) {
				if (nextTag.key != startTag.key) {
					setError("Tag start/end key mismatch", nextTag.start);
					return Tag();
				}
				return nextTag;
			}
		}
		pos = nextTag.end;
	}

	return Tag();
}